

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O2

unsigned_long bn_add_part_words(unsigned_long *r,unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = bn_add_words(r,a,b,cl);
  if (dl != 0) {
    if (dl < 0) {
      lVar2 = 0;
      while (uVar1 != 0) {
        uVar3 = dl + (int)lVar2;
        uVar4 = (ulong)CARRY8(uVar1,b[cl + lVar2]);
        r[cl + lVar2] = uVar1 + b[cl + lVar2];
        if (-2 < (int)uVar3) {
          return uVar4;
        }
        uVar1 = (ulong)CARRY8(uVar4,b[(long)cl + lVar2 + 1]);
        r[(long)cl + lVar2 + 1] = uVar4 + b[(long)cl + lVar2 + 1];
        if (uVar3 == 0xfffffffe) {
          return uVar1;
        }
        uVar4 = (ulong)CARRY8(uVar1,b[(long)cl + lVar2 + 2]);
        r[(long)cl + lVar2 + 2] = uVar1 + b[(long)cl + lVar2 + 2];
        if (0xfffffffc < uVar3) {
          return uVar4;
        }
        uVar1 = (ulong)CARRY8(uVar4,b[(long)cl + lVar2 + 3]);
        r[(long)cl + lVar2 + 3] = uVar4 + b[(long)cl + lVar2 + 3];
        if (uVar3 == 0xfffffffc) {
          return uVar1;
        }
        lVar2 = lVar2 + 4;
      }
      uVar1 = 0;
      while( true ) {
        uVar3 = dl + (int)lVar2;
        r[cl + lVar2] = b[cl + lVar2];
        if ((((uVar3 == 0xffffffff) ||
             (r[(long)cl + lVar2 + 1] = b[(long)cl + lVar2 + 1], uVar3 == 0xfffffffe)) ||
            (r[(long)cl + lVar2 + 2] = b[(long)cl + lVar2 + 2], 0xfffffffc < uVar3)) ||
           (r[(long)cl + lVar2 + 3] = b[(long)cl + lVar2 + 3], uVar3 == 0xfffffffc)) break;
        lVar2 = lVar2 + 4;
      }
    }
    else {
      lVar2 = 0;
      uVar3 = dl;
      while (uVar1 != 0) {
        uVar4 = (ulong)CARRY8(uVar1,a[cl + lVar2]);
        r[cl + lVar2] = uVar1 + a[cl + lVar2];
        if ((int)uVar3 < 2) {
          return uVar4;
        }
        uVar1 = (ulong)CARRY8(uVar4,a[(long)cl + lVar2 + 1]);
        r[(long)cl + lVar2 + 1] = uVar4 + a[(long)cl + lVar2 + 1];
        if (dl + -2 == (int)lVar2) {
          return uVar1;
        }
        uVar4 = (ulong)CARRY8(uVar1,a[(long)cl + lVar2 + 2]);
        r[(long)cl + lVar2 + 2] = uVar1 + a[(long)cl + lVar2 + 2];
        bVar5 = uVar3 < 4;
        uVar3 = uVar3 - 4;
        if (bVar5) {
          return uVar4;
        }
        uVar1 = (ulong)CARRY8(uVar4,a[(long)cl + lVar2 + 3]);
        r[(long)cl + lVar2 + 3] = uVar4 + a[(long)cl + lVar2 + 3];
        if (dl + -4 == (int)lVar2) {
          return uVar1;
        }
        lVar2 = lVar2 + 4;
      }
      uVar1 = 0;
      while (r[cl + lVar2] = a[cl + lVar2], 1 < uVar3) {
        r[(long)cl + lVar2 + 1] = a[(long)cl + lVar2 + 1];
        if (-dl + (int)lVar2 == -2) {
          return 0;
        }
        r[(long)cl + lVar2 + 2] = a[(long)cl + lVar2 + 2];
        bVar5 = uVar3 < 4;
        uVar3 = uVar3 - 4;
        if (bVar5) {
          return 0;
        }
        r[(long)cl + lVar2 + 3] = a[(long)cl + lVar2 + 3];
        if (-dl + (int)lVar2 == -4) {
          return 0;
        }
        lVar2 = lVar2 + 4;
      }
    }
  }
  return uVar1;
}

Assistant:

BN_ULONG bn_add_part_words(BN_ULONG *r,
                           const BN_ULONG *a, const BN_ULONG *b,
                           int cl, int dl)
{
    BN_ULONG c, l, t;

    assert(cl >= 0);
    c = bn_add_words(r, a, b, cl);

    if (dl == 0)
        return c;

    r += cl;
    a += cl;
    b += cl;

    if (dl < 0) {
        int save_dl = dl;
        while (c) {
            l = (c + b[0]) & BN_MASK2;
            c = (l < c);
            r[0] = l;
            if (++dl >= 0)
                break;

            l = (c + b[1]) & BN_MASK2;
            c = (l < c);
            r[1] = l;
            if (++dl >= 0)
                break;

            l = (c + b[2]) & BN_MASK2;
            c = (l < c);
            r[2] = l;
            if (++dl >= 0)
                break;

            l = (c + b[3]) & BN_MASK2;
            c = (l < c);
            r[3] = l;
            if (++dl >= 0)
                break;

            save_dl = dl;
            b += 4;
            r += 4;
        }
        if (dl < 0) {
            if (save_dl < dl) {
                switch (dl - save_dl) {
                case 1:
                    r[1] = b[1];
                    if (++dl >= 0)
                        break;
                case 2:
                    r[2] = b[2];
                    if (++dl >= 0)
                        break;
                case 3:
                    r[3] = b[3];
                    if (++dl >= 0)
                        break;
                }
                b += 4;
                r += 4;
            }
        }
        if (dl < 0) {
            for (;;) {
                r[0] = b[0];
                if (++dl >= 0)
                    break;
                r[1] = b[1];
                if (++dl >= 0)
                    break;
                r[2] = b[2];
                if (++dl >= 0)
                    break;
                r[3] = b[3];
                if (++dl >= 0)
                    break;

                b += 4;
                r += 4;
            }
        }
    } else {
        int save_dl = dl;
        while (c) {
            t = (a[0] + c) & BN_MASK2;
            c = (t < c);
            r[0] = t;
            if (--dl <= 0)
                break;

            t = (a[1] + c) & BN_MASK2;
            c = (t < c);
            r[1] = t;
            if (--dl <= 0)
                break;

            t = (a[2] + c) & BN_MASK2;
            c = (t < c);
            r[2] = t;
            if (--dl <= 0)
                break;

            t = (a[3] + c) & BN_MASK2;
            c = (t < c);
            r[3] = t;
            if (--dl <= 0)
                break;

            save_dl = dl;
            a += 4;
            r += 4;
        }
        if (dl > 0) {
            if (save_dl > dl) {
                switch (save_dl - dl) {
                case 1:
                    r[1] = a[1];
                    if (--dl <= 0)
                        break;
                case 2:
                    r[2] = a[2];
                    if (--dl <= 0)
                        break;
                case 3:
                    r[3] = a[3];
                    if (--dl <= 0)
                        break;
                }
                a += 4;
                r += 4;
            }
        }
        if (dl > 0) {
            for (;;) {
                r[0] = a[0];
                if (--dl <= 0)
                    break;
                r[1] = a[1];
                if (--dl <= 0)
                    break;
                r[2] = a[2];
                if (--dl <= 0)
                    break;
                r[3] = a[3];
                if (--dl <= 0)
                    break;

                a += 4;
                r += 4;
            }
        }
    }
    return c;
}